

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  uint uVar1;
  tmbchar indent_buf [32];
  
  do {
    if (node == (Node *)0x0) {
      return;
    }
    if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_BLOCKQUOTE)) ||
       (node->implicit == no)) {
      if (node->content != (Node *)0x0) {
        prvTidyBQ2Div(doc,node->content);
      }
    }
    else {
      uVar1 = 2;
      while( true ) {
        node_00 = node->content;
        if (node_00 == (Node *)0x0) break;
        if (((node_00->next != (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
           ((node_00->tag->id != TidyTag_BLOCKQUOTE || (node->implicit == no)))) {
          prvTidyBQ2Div(doc,node_00);
          break;
        }
        StripOnlyChild(doc,node);
        uVar1 = uVar1 + 2;
      }
      prvTidytmbsnprintf(indent_buf,0x20,"margin-left: %dem",(ulong)uVar1);
      RenameElem(doc,node,TidyTag_DIV);
      prvTidyAddStyleProperty(doc,node,indent_buf);
    }
    node = node->next;
  } while( true );
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            if (node->content)
                TY_(BQ2Div)( doc, node->content );

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );
        }
        else if (node->content)
            TY_(BQ2Div)( doc, node->content );

        node = node->next;
    }
}